

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchcontrollers.cpp
# Opt level: O1

void __thiscall CorUnix::CSynchControllerBase::Release(CSynchControllerBase *this)

{
  long lVar1;
  ThreadWaitInfo *pTVar2;
  CPalThread *pCVar3;
  
  pTVar2 = CPalSynchronizationManager::GetThreadWaitInfo(this->m_pthrOwner);
  lVar1 = CPalSynchronizationManager::s_pObjSynchMgr;
  pCVar3 = (CPalThread *)pthread_getspecific(thObjKey);
  if (pCVar3 == (CPalThread *)0x0) {
    pCVar3 = CreateCurrentThreadData();
  }
  if (pCVar3 != this->m_pthrOwner) {
    fprintf(_stderr,"] %s %s:%d","Release",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchcontrollers.cpp"
            ,100);
    fprintf(_stderr,"Expression: InternalGetCurrentThread() == m_pthrOwner\n");
  }
  if (pTVar2->pthrOwner != this->m_pthrOwner) {
    fprintf(_stderr,"] %s %s:%d","Release",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchcontrollers.cpp"
            ,0x65);
    fprintf(_stderr,"Expression: ptwiWaitInfo->pthrOwner == m_pthrOwner\n");
  }
  CSynchData::Release(this->m_psdSynchData,this->m_pthrOwner);
  if (this->m_wdWaitDomain != LocalWait) {
    CPalSynchronizationManager::ReleaseSharedSynchLock(this->m_pthrOwner);
  }
  CPalSynchronizationManager::ReleaseLocalSynchLock(this->m_pthrOwner);
  if (this->m_ctCtrlrType != WaitController) {
    CSynchCache<CorUnix::CSynchStateController>::Add
              ((CSynchCache<CorUnix::CSynchStateController> *)(lVar1 + 0xe8),this->m_pthrOwner,
               (CSynchStateController *)&this[-1].m_wdWaitDomain);
    return;
  }
  CSynchCache<CorUnix::CSynchWaitController>::Add
            ((CSynchCache<CorUnix::CSynchWaitController> *)(lVar1 + 0x40),this->m_pthrOwner,
             (CSynchWaitController *)&this[-1].m_wdWaitDomain);
  return;
}

Assistant:

void CSynchControllerBase::Release()
    {
        VALIDATEOBJECT(m_psdSynchData);

#ifdef _DEBUG
        ThreadWaitInfo * ptwiWaitInfo = 
            CPalSynchronizationManager::GetThreadWaitInfo(m_pthrOwner);
#endif // _DEBUG

        CPalSynchronizationManager * pSynchManager = 
            CPalSynchronizationManager::GetInstance();

        _ASSERTE(InternalGetCurrentThread() == m_pthrOwner);
        _ASSERTE(ptwiWaitInfo->pthrOwner == m_pthrOwner);

        // Release reference to target synch data
        m_psdSynchData->Release(m_pthrOwner);

        // Release lock implied by the controller
        if (LocalWait != m_wdWaitDomain)
        {
            CPalSynchronizationManager::ReleaseSharedSynchLock(m_pthrOwner);
        }        
        CPalSynchronizationManager::ReleaseLocalSynchLock(m_pthrOwner);

        // Return controller to the appropriate cache
        if (WaitController == m_ctCtrlrType)
        {
            // The cast here must be static_cast and not reinterpet_cast.
            // In fact in general static_cast<CSynchWaitController*>(this) is  
            // equal to this-sizeof(void*), given that CSynchWaitController 
            // has a virtual table, while CSynchControllerBase doesn't.
            pSynchManager->CacheAddWaitCtrlr(m_pthrOwner,
                static_cast<CSynchWaitController*>(this));
        }
        else
        {
            // The cast here must be static_cast and not reinterpet_cast
            pSynchManager->CacheAddStateCtrlr(m_pthrOwner,
                static_cast<CSynchStateController*>(this));
        }
    }